

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O3

double double_conversion::RadixStringToIeee<3,char*>
                 (char **current,char *end,bool sign,uc16 separator,bool parse_as_hex_float,
                 bool allow_trailing_junk,double junk_string_value,bool read_as_double,
                 bool *result_is_junk)

{
  char cVar1;
  undefined1 *puVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  double dVar7;
  byte bVar8;
  int iVar9;
  undefined6 in_register_0000000a;
  ulong uVar10;
  undefined7 in_register_00000011;
  char **ppcVar11;
  char **end_00;
  long lVar12;
  byte bVar13;
  uint uVar14;
  Double *this;
  uint uVar15;
  bool bVar16;
  DiyFp diy_fp;
  undefined7 in_stack_00000009;
  char *local_70;
  uint local_68;
  undefined4 local_64;
  ulong local_60;
  char **local_58;
  char *local_50;
  double local_48;
  
  ppcVar11 = (char **)CONCAT62(in_register_0000000a,separator);
  puVar2 = (undefined1 *)CONCAT71(in_stack_00000009,read_as_double);
  *puVar2 = 1;
  local_70 = end;
  local_50 = end;
  local_48 = junk_string_value;
  while (**current == '0') {
    bVar3 = Advance<char*>(current,separator,(int)&local_70,ppcVar11);
    if (bVar3) {
      *puVar2 = 0;
      if (sign) {
        return -0.0;
      }
      return 0.0;
    }
  }
  ppcVar11 = (char **)0x18;
  if (allow_trailing_junk) {
    ppcVar11 = (char **)0x35;
  }
  this = (Double *)0x0;
  while( true ) {
    pcVar6 = *current;
    iVar9 = (int)*pcVar6;
    if ((0x37 < iVar9) || (9 < iVar9 - 0x30U)) {
      if (pcVar6 != local_50 && !parse_as_hex_float) {
        do {
          lVar12 = 0;
          while ((&kWhitespaceTable7)[lVar12] != *pcVar6) {
            lVar12 = lVar12 + 1;
            if (lVar12 == 6) {
              return local_48;
            }
          }
          pcVar6 = pcVar6 + 1;
          *current = pcVar6;
        } while (pcVar6 != local_50);
      }
      goto LAB_005f1d5f;
    }
    this = (Double *)((long)iVar9 + (long)this * 8 + -0x30);
    uVar5 = (long)this >> (sbyte)ppcVar11;
    if ((int)uVar5 != 0) break;
    bVar3 = Advance<char*>(current,separator,(int)&local_70,ppcVar11);
    if (bVar3) {
LAB_005f1d5f:
      *(undefined1 *)CONCAT71(in_stack_00000009,read_as_double) = 0;
      bVar3 = this == (Double *)0x0;
LAB_005f1d70:
      if (sign != false) {
        if (bVar3) {
          return -0.0;
        }
        this = (Double *)-(long)this;
      }
      return (double)(long)this;
    }
  }
  local_64 = (undefined4)CONCAT71(in_register_00000011,sign);
  end_00 = (char **)0x1;
  if (1 < (int)uVar5) {
    uVar10 = uVar5 & 0xffffffff;
    do {
      end_00 = (char **)(ulong)((int)end_00 + 1);
      uVar10 = uVar10 >> 1;
      uVar15 = (uint)uVar5;
      uVar5 = uVar10;
    } while (3 < uVar15);
  }
  uVar15 = (uint)end_00;
  bVar8 = (byte)end_00;
  local_68 = -1 << (bVar8 & 0x1f);
  local_60 = (long)this >> (bVar8 & 0x3f);
  local_58 = ppcVar11;
  bVar3 = Advance<char*>(current,separator,(int)&local_70,end_00);
  bVar13 = 1;
  while (!bVar3) {
    uVar15 = (uint)end_00;
    cVar1 = **current;
    if ((0x37 < cVar1) || (uVar4 = (int)cVar1 - 0x30, 9 < uVar4)) break;
    bVar13 = bVar13 & cVar1 == '0';
    uVar15 = uVar15 + 3;
    end_00 = (char **)(ulong)uVar15;
    bVar3 = Advance<char*>(current,separator,(int)&local_70,(char **)(ulong)uVar4);
  }
  if (!parse_as_hex_float) {
    pcVar6 = *current;
    while (pcVar6 != local_50) {
      lVar12 = 0;
      while ((&kWhitespaceTable7)[lVar12] != *pcVar6) {
        lVar12 = lVar12 + 1;
        if (lVar12 == 6) {
          return local_48;
        }
      }
      pcVar6 = pcVar6 + 1;
      *current = pcVar6;
    }
  }
  uVar14 = (uint)this & ~local_68;
  uVar4 = 1 << (bVar8 - 1 & 0x1f);
  if ((int)uVar4 < (int)uVar14) {
    uVar5 = local_60 + 1;
  }
  else {
    uVar5 = local_60;
    if (uVar14 == uVar4) {
      uVar5 = local_60 + ((byte)(~bVar13 | (byte)local_60) & 1);
    }
  }
  diy_fp._8_8_ = (undefined1 *)CONCAT71(in_stack_00000009,read_as_double);
  bVar16 = (uVar5 >> ((ulong)local_58 & 0x3f) & 1) != 0;
  this = (Double *)((long)uVar5 >> bVar16);
  bVar3 = this == (Double *)0x0;
  *diy_fp._8_8_ = 0;
  uVar15 = uVar15 + bVar16;
  sign = SUB41(local_64,0);
  if ((uVar15 != 0) && (this != (Double *)0x0)) {
    diy_fp.f_ = (ulong)uVar15;
    dVar7 = (double)Double::DiyFpToUint64(this,diy_fp);
    if (sign != false) {
      return (double)((ulong)dVar7 ^ (ulong)DAT_03104cf0);
    }
    return dVar7;
  }
  goto LAB_005f1d70;
}

Assistant:

static double RadixStringToIeee(Iterator* current,
                                Iterator end,
                                bool sign,
                                uc16 separator,
                                bool parse_as_hex_float,
                                bool allow_trailing_junk,
                                double junk_string_value,
                                bool read_as_double,
                                bool* result_is_junk) {
  DOUBLE_CONVERSION_ASSERT(*current != end);
  DOUBLE_CONVERSION_ASSERT(!parse_as_hex_float ||
      IsHexFloatString(*current, end, separator, allow_trailing_junk));

  const int kDoubleSize = Double::kSignificandSize;
  const int kSingleSize = Single::kSignificandSize;
  const int kSignificandSize = read_as_double? kDoubleSize: kSingleSize;

  *result_is_junk = true;

  int64_t number = 0;
  int exponent = 0;
  const int radix = (1 << radix_log_2);
  // Whether we have encountered a '.' and are parsing the decimal digits.
  // Only relevant if parse_as_hex_float is true.
  bool post_decimal = false;

  // Skip leading 0s.
  while (**current == '0') {
    if (Advance(current, separator, radix, end)) {
      *result_is_junk = false;
      return SignedZero(sign);
    }
  }

  while (true) {
    int digit;
    if (IsDecimalDigitForRadix(**current, radix)) {
      digit = static_cast<char>(**current) - '0';
      if (post_decimal) exponent -= radix_log_2;
    } else if (IsCharacterDigitForRadix(**current, radix, 'a')) {
      digit = static_cast<char>(**current) - 'a' + 10;
      if (post_decimal) exponent -= radix_log_2;
    } else if (IsCharacterDigitForRadix(**current, radix, 'A')) {
      digit = static_cast<char>(**current) - 'A' + 10;
      if (post_decimal) exponent -= radix_log_2;
    } else if (parse_as_hex_float && **current == '.') {
      post_decimal = true;
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
      continue;
    } else if (parse_as_hex_float && (**current == 'p' || **current == 'P')) {
      break;
    } else {
      if (allow_trailing_junk || !AdvanceToNonspace(current, end)) {
        break;
      } else {
        return junk_string_value;
      }
    }

    number = number * radix + digit;
    int overflow = static_cast<int>(number >> kSignificandSize);
    if (overflow != 0) {
      // Overflow occurred. Need to determine which direction to round the
      // result.
      int overflow_bits_count = 1;
      while (overflow > 1) {
        overflow_bits_count++;
        overflow >>= 1;
      }

      int dropped_bits_mask = ((1 << overflow_bits_count) - 1);
      int dropped_bits = static_cast<int>(number) & dropped_bits_mask;
      number >>= overflow_bits_count;
      exponent += overflow_bits_count;

      bool zero_tail = true;
      for (;;) {
        if (Advance(current, separator, radix, end)) break;
        if (parse_as_hex_float && **current == '.') {
          // Just run over the '.'. We are just trying to see whether there is
          // a non-zero digit somewhere.
          Advance(current, separator, radix, end);
          DOUBLE_CONVERSION_ASSERT(*current != end);
          post_decimal = true;
        }
        if (!isDigit(**current, radix)) break;
        zero_tail = zero_tail && **current == '0';
        if (!post_decimal) exponent += radix_log_2;
      }

      if (!parse_as_hex_float &&
          !allow_trailing_junk &&
          AdvanceToNonspace(current, end)) {
        return junk_string_value;
      }

      int middle_value = (1 << (overflow_bits_count - 1));
      if (dropped_bits > middle_value) {
        number++;  // Rounding up.
      } else if (dropped_bits == middle_value) {
        // Rounding to even to consistency with decimals: half-way case rounds
        // up if significant part is odd and down otherwise.
        if ((number & 1) != 0 || !zero_tail) {
          number++;  // Rounding up.
        }
      }

      // Rounding up may cause overflow.
      if ((number & ((int64_t)1 << kSignificandSize)) != 0) {
        exponent++;
        number >>= 1;
      }
      break;
    }
    if (Advance(current, separator, radix, end)) break;
  }

  DOUBLE_CONVERSION_ASSERT(number < ((int64_t)1 << kSignificandSize));
  DOUBLE_CONVERSION_ASSERT(static_cast<int64_t>(static_cast<double>(number)) == number);

  *result_is_junk = false;

  if (parse_as_hex_float) {
    DOUBLE_CONVERSION_ASSERT(**current == 'p' || **current == 'P');
    Advance(current, separator, radix, end);
    DOUBLE_CONVERSION_ASSERT(*current != end);
    bool is_negative = false;
    if (**current == '+') {
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
    } else if (**current == '-') {
      is_negative = true;
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
    }
    int written_exponent = 0;
    while (IsDecimalDigitForRadix(**current, 10)) {
      // No need to read exponents if they are too big. That could potentially overflow
      // the `written_exponent` variable.
      if (abs(written_exponent) <= 100 * Double::kMaxExponent) {
        written_exponent = 10 * written_exponent + **current - '0';
      }
      if (Advance(current, separator, radix, end)) break;
    }
    if (is_negative) written_exponent = -written_exponent;
    exponent += written_exponent;
  }

  if (exponent == 0 || number == 0) {
    if (sign) {
      if (number == 0) return -0.0;
      number = -number;
    }
    return static_cast<double>(number);
  }

  DOUBLE_CONVERSION_ASSERT(number != 0);
  double result = Double(DiyFp(number, exponent)).value();
  return sign ? -result : result;
}